

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseRefreshLine(void)

{
  bool bVar1;
  char *s;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  undefined8 local_98;
  char seq [64];
  abuf local_48;
  int local_34;
  
  if (mlmode == 0) {
    sVar2 = strlen(ls.prompt);
    uVar7 = ls.pos + sVar2;
    uVar5 = ls.cols - 1;
    if (uVar7 < ls.cols - 1) {
      uVar5 = uVar7;
    }
    pcVar10 = ls.buf + (uVar7 - uVar5);
    uVar7 = (CONCAT44(ls.len._4_4_,(int)ls.len) - ls.pos) + uVar5;
    if (ls.cols < uVar7) {
      uVar7 = ls.cols;
    }
    local_48.b = (char *)0x0;
    local_48.len = 0;
    local_34 = ls.ofd;
    local_98 = CONCAT62(local_98._2_6_,0xd);
    sVar3 = strlen((char *)&local_98);
    abAppend(&local_48,(char *)&local_98,(int)sVar3);
    s = ls.prompt;
    sVar3 = strlen(ls.prompt);
    abAppend(&local_48,s,(int)sVar3);
    abAppend(&local_48,pcVar10,(int)uVar7 - (int)sVar2);
    local_98._4_4_ = (uint)((ulong)local_98 >> 0x20) & 0xffffff00;
    local_98 = CONCAT44(local_98._4_4_,0x4b305b1b);
    sVar2 = strlen((char *)&local_98);
    abAppend(&local_48,(char *)&local_98,(int)sVar2);
    snprintf((char *)&local_98,0x40,"\r\x1b[%dC",uVar5 & 0xffffffff);
    sVar2 = strlen((char *)&local_98);
    abAppend(&local_48,(char *)&local_98,(int)sVar2);
  }
  else {
    seq._56_8_ = strlen(ls.prompt);
    lVar9 = (long)(int)seq._56_8_;
    iVar4 = (int)ls.maxrows;
    iVar6 = (int)(((CONCAT44(ls.len._4_4_,(int)ls.len) + ls.cols + lVar9) - 1) / ls.cols);
    if ((int)ls.maxrows < iVar6) {
      ls.maxrows = (size_t)iVar6;
    }
    local_48.b = (char *)0x0;
    local_48.len = 0;
    local_34 = ls.ofd;
    if ((int)((ls.cols + lVar9 + ls.oldpos) / ls.cols) < iVar4) {
      snprintf((char *)&local_98,0x40,"\x1b[%dB");
      sVar2 = strlen((char *)&local_98);
      abAppend(&local_48,(char *)&local_98,(int)sVar2);
    }
    iVar8 = 1;
    if (1 < iVar4) {
      iVar8 = iVar4;
    }
    while (iVar8 = iVar8 + -1, iVar8 != 0) {
      local_98 = 0x315b1b4b305b1b0d;
      seq[0] = 'A';
      seq[1] = '\0';
      sVar2 = strlen((char *)&local_98);
      abAppend(&local_48,(char *)&local_98,(int)sVar2);
    }
    local_98 = CONCAT26(local_98._6_2_,0x4b00000000);
    local_98 = CONCAT44(local_98._4_4_,0x305b1b0d);
    sVar2 = strlen((char *)&local_98);
    abAppend(&local_48,(char *)&local_98,(int)sVar2);
    pcVar10 = ls.prompt;
    sVar2 = strlen(ls.prompt);
    abAppend(&local_48,pcVar10,(int)sVar2);
    abAppend(&local_48,ls.buf,(int)ls.len);
    if (((ls.pos != 0) && (ls.pos == CONCAT44(ls.len._4_4_,(int)ls.len))) &&
       ((ls.pos + lVar9) % ls.cols == 0)) {
      abAppend(&local_48,"\n",1);
      local_98 = CONCAT62(local_98._2_6_,0xd);
      sVar2 = strlen((char *)&local_98);
      abAppend(&local_48,(char *)&local_98,(int)sVar2);
      iVar4 = iVar6 + 1;
      bVar1 = (int)ls.maxrows <= iVar6;
      iVar6 = iVar4;
      if (bVar1) {
        ls.maxrows = (size_t)iVar4;
      }
    }
    if ((int)((lVar9 + ls.pos + ls.cols) / ls.cols) < iVar6) {
      snprintf((char *)&local_98,0x40,"\x1b[%dA");
      sVar2 = strlen((char *)&local_98);
      abAppend(&local_48,(char *)&local_98,(int)sVar2);
    }
    uVar7 = (long)((int)ls.pos + seq._56_4_) % (long)(int)ls.cols;
    if ((int)uVar7 == 0) {
      local_98 = CONCAT62(local_98._2_6_,0xd);
    }
    else {
      snprintf((char *)&local_98,0x40,"\r\x1b[%dC",uVar7 & 0xffffffff);
    }
    sVar2 = strlen((char *)&local_98);
    abAppend(&local_48,(char *)&local_98,(int)sVar2);
    ls.oldpos = ls.pos;
  }
  pcVar10 = local_48.b;
  write(local_34,local_48.b,(long)local_48.len);
  free(pcVar10);
  return;
}

Assistant:

void linenoiseRefreshLine(void) {
    if (mlmode)
        refreshMultiLine(&ls);
    else
        refreshSingleLine(&ls);
}